

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  Display *pDVar1;
  X11_info *pXVar2;
  CImgDisplay *pCVar3;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == true)) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    XLockDisplay(pDVar1);
    if (this->_is_fullscreen == true) {
      _init_fullscreen(this);
    }
    _map_window(this);
    this->_is_closed = false;
    XUnlockDisplay(pDVar1);
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  return this;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      _is_closed = false;
      XUnlockDisplay(dpy);
      return paint();
    }